

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O0

void __thiscall ncnn::ParamDict::set(ParamDict *this,int id,Mat *v)

{
  int in_ESI;
  Mat *in_RDI;
  undefined4 in_stack_fffffffffffffff0;
  
  in_RDI->refcount[(long)in_ESI * 0x14] = 4;
  ncnn::Mat::operator=(in_RDI,(Mat *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  return;
}

Assistant:

void ParamDict::set(int id, const Mat& v)
{
    d->params[id].type = 4;
    d->params[id].v = v;
}